

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

int zt_cstr_cmp(char *s1,ssize_t i1,ssize_t j1,char *s2,ssize_t i2,ssize_t j2)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *__s2;
  long lVar8;
  char *__s1;
  
  sVar3 = strlen(s1);
  if (sVar3 == 0) {
    lVar7 = 0;
    lVar8 = 0;
  }
  else {
    if (i1 < 0) {
      lVar4 = sVar3 - 1;
      if ((long)(i1 + sVar3) < (long)sVar3) {
        lVar4 = i1 + sVar3;
      }
    }
    else {
      lVar4 = sVar3 - 1;
      if (i1 < (long)sVar3) {
        lVar4 = i1;
      }
    }
    if (j1 < 0) {
      lVar8 = sVar3 - 1;
      if ((long)(j1 + sVar3) < (long)sVar3) {
        lVar8 = j1 + sVar3;
      }
    }
    else {
      lVar8 = sVar3 - 1;
      if (j1 < (long)sVar3) {
        lVar8 = j1;
      }
    }
    lVar7 = lVar8;
    if (lVar8 < lVar4) {
      lVar7 = lVar4;
    }
    if (lVar4 < lVar8) {
      lVar8 = lVar4;
    }
  }
  sVar3 = strlen(s2);
  if (sVar3 == 0) {
    lVar4 = 0;
    lVar5 = 0;
  }
  else {
    if (i2 < 0) {
      lVar6 = sVar3 - 1;
      if ((long)(i2 + sVar3) < (long)sVar3) {
        lVar6 = i2 + sVar3;
      }
    }
    else {
      lVar6 = sVar3 - 1;
      if (i2 < (long)sVar3) {
        lVar6 = i2;
      }
    }
    if (j2 < 0) {
      lVar5 = sVar3 - 1;
      if ((long)(j2 + sVar3) < (long)sVar3) {
        lVar5 = j2 + sVar3;
      }
    }
    else {
      lVar5 = sVar3 - 1;
      if (j2 < (long)sVar3) {
        lVar5 = j2;
      }
    }
    lVar4 = lVar5;
    if (lVar5 < lVar6) {
      lVar4 = lVar6;
    }
    if (lVar6 < lVar5) {
      lVar5 = lVar6;
    }
  }
  __s1 = s1 + lVar8;
  __s2 = s2 + lVar5;
  sVar3 = lVar7 - lVar8;
  if ((long)sVar3 < lVar4 - lVar5) {
    lVar8 = lVar8 - lVar7;
    lVar7 = -lVar8;
    if (0 < lVar8) {
      lVar7 = lVar8;
    }
    uVar1 = strncmp(__s1,__s2,lVar7 + 1);
    uVar1 = uVar1 | -(uint)(uVar1 == 0);
  }
  else {
    if ((long)sVar3 <= lVar4 - lVar5) {
      iVar2 = strncmp(__s1,__s2,sVar3);
      return iVar2;
    }
    lVar5 = lVar5 - lVar4;
    lVar8 = -lVar5;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    iVar2 = strncmp(__s1,__s2,lVar8 + 1);
    uVar1 = iVar2 + (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int
zt_cstr_cmp(const char *s1, ssize_t i1, ssize_t j1,
            const char *s2, ssize_t i2, ssize_t j2) {
    CONVERT(s1, i1, j1);
    CONVERT(s2, i2, j2);

    s1 += i1;
    s2 += i2;

    if (j1 - i1 < j2 - i2) {
        int cond = strncmp(s1, s2, IDXLEN(i1, j1));
        return cond == 0 ? -1 : cond;
    } else if (j1 - i1 > j2 - i2) {
        int cond = strncmp(s1, s2, IDXLEN(i2, j2));
        return cond == 0 ? +1 : cond;
    }

    return strncmp(s1, s2, j1 - i1);
}